

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# storage.cpp
# Opt level: O2

void __thiscall CStorage::CStorage(CStorage *this)

{
  (this->super_IStorage).super_IInterface.m_pKernel = (IKernel *)0x0;
  (this->super_IStorage).super_IInterface._vptr_IInterface = (_func_int **)&PTR__IInterface_0015dca8
  ;
  mem_zero(this->m_aaStoragePaths,0x2000);
  this->m_NumPaths = 0;
  this->m_aDataDir[0] = '\0';
  this->m_aUserDir[0] = '\0';
  this->m_aCurrentDir[0] = '\0';
  this->m_aAppDir[0] = '\0';
  return;
}

Assistant:

CStorage()
	{
		mem_zero(m_aaStoragePaths, sizeof(m_aaStoragePaths));
		m_NumPaths = 0;
		m_aDataDir[0] = 0;
		m_aUserDir[0] = 0;
		m_aCurrentDir[0] = 0;
		m_aAppDir[0] = 0;
	}